

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

void __thiscall CHeap::growheap(CHeap *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  heapelement *phVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  int iVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar7 = 20000000;
  if (this->allocated < 0x989681) {
    iVar7 = this->allocated * 2;
  }
  uVar11 = (ulong)iVar7;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  this->allocated = iVar7;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar5 * ZEXT816(0x18),0) | 8;
  }
  puVar8 = (ulong *)operator_new__(uVar10);
  *puVar8 = uVar11;
  if (iVar7 != 0) {
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)puVar8 + lVar9 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar9 = lVar9 + 0x18;
    } while (uVar11 * 0x18 != lVar9);
  }
  uVar3 = this->currentsize;
  phVar4 = this->heap;
  if ((int)uVar3 < 0) {
    if (phVar4 == (heapelement *)0x0) goto LAB_00140542;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar9 + 8) =
           *(undefined8 *)((long)(phVar4->key).key + lVar9 + -8);
      puVar1 = (undefined8 *)((long)(phVar4->key).key + lVar9);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar8 + lVar9 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar9 = lVar9 + 0x18;
    } while ((ulong)uVar3 * 0x18 + 0x18 != lVar9);
  }
  operator_delete__(phVar4[-1].key.key + 1,phVar4[-1].key.key[1] * 0x18 + 8);
LAB_00140542:
  this->heap = (heapelement *)(puVar8 + 1);
  return;
}

Assistant:

void CHeap::growheap()
{
    heapelement* newheap;
    int i;

    SBPL_PRINTF("growing heap size from %d ", allocated);

    allocated = 2 * allocated;
    if (allocated > HEAPSIZE) allocated = HEAPSIZE;

    SBPL_PRINTF("to %d\n", allocated);

    newheap = new heapelement[allocated];

    for (i = 0; i <= currentsize; ++i)
        newheap[i] = heap[i];

    delete[] heap;

    heap = newheap;
}